

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O1

void __thiscall Pl_StdioFile::~Pl_StdioFile(Pl_StdioFile *this)

{
  ~Pl_StdioFile(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_StdioFile::~Pl_StdioFile() = default;